

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::loadBook(istream *fileStream,IStorage *storage,string *fileName)

{
  File *this;
  Exception *x;
  vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> boundSheets;
  unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> stream;
  File file;
  unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> *in_stack_fffffffffffffc20;
  Directory *in_stack_fffffffffffffc30;
  File *in_stack_fffffffffffffc38;
  allocator *in_stack_fffffffffffffc40;
  Stream *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined1 uVar1;
  istream *in_stack_fffffffffffffc58;
  allocator *paVar2;
  File *in_stack_fffffffffffffc60;
  bool local_37b;
  allocator local_379;
  wstring local_378 [24];
  wstring *in_stack_fffffffffffffca0;
  undefined5 in_stack_fffffffffffffca8;
  byte bVar3;
  byte bVar4;
  allocator<wchar_t> in_stack_fffffffffffffcaf;
  wstring local_350 [39];
  allocator local_329;
  wstring local_328 [456];
  IStorage *in_stack_fffffffffffffea0;
  Stream *in_stack_fffffffffffffea8;
  vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *in_stack_fffffffffffffeb0;
  
  CompoundFile::File::File
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             (string *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  paVar2 = &local_329;
  std::allocator<wchar_t>::allocator();
  bVar4 = 0;
  bVar3 = 0;
  std::__cxx11::wstring::wstring(local_328,L"Workbook",paVar2);
  local_37b = CompoundFile::File::hasDirectory
                        (in_stack_fffffffffffffc38,&in_stack_fffffffffffffc30->m_name);
  uVar1 = local_37b;
  if (local_37b) {
    in_stack_fffffffffffffc48 = (Stream *)&stack0xfffffffffffffcaf;
    std::allocator<wchar_t>::allocator();
    bVar4 = 1;
    std::__cxx11::wstring::wstring(local_350,L"Workbook",(allocator *)in_stack_fffffffffffffc48);
    bVar3 = 1;
    CompoundFile::File::directory
              ((File *)CONCAT17(in_stack_fffffffffffffcaf,
                                CONCAT16(bVar4,CONCAT15(1,in_stack_fffffffffffffca8))),
               in_stack_fffffffffffffca0);
  }
  else {
    in_stack_fffffffffffffc40 = &local_379;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_378,L"Book",in_stack_fffffffffffffc40);
    CompoundFile::File::directory
              ((File *)CONCAT17(in_stack_fffffffffffffcaf,
                                CONCAT16(bVar4,CONCAT15(bVar3,in_stack_fffffffffffffca8))),
               in_stack_fffffffffffffca0);
  }
  local_37b = !local_37b;
  CompoundFile::File::stream(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  CompoundFile::Directory::~Directory((Directory *)0x12f183);
  if (local_37b) {
    std::__cxx11::wstring::~wstring(local_378);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_379);
  }
  if ((bVar3 & 1) != 0) {
    std::__cxx11::wstring::~wstring(local_350);
  }
  if ((bVar4 & 1) != 0) {
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&stack0xfffffffffffffcaf);
  }
  std::__cxx11::wstring::~wstring(local_328);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_329);
  std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::vector
            ((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)0x12f1ff);
  std::unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_>::operator*
            (in_stack_fffffffffffffc20);
  loadGlobals(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  this = (File *)std::unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_>::operator*
                           (in_stack_fffffffffffffc20);
  loadWorkSheets((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48,
                 (IStorage *)in_stack_fffffffffffffc40);
  std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::~vector
            ((vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *)this);
  std::unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_>::~unique_ptr
            ((unique_ptr<Excel::Stream,_std::default_delete<Excel::Stream>_> *)this);
  CompoundFile::File::~File(this);
  return;
}

Assistant:

inline void
Parser::loadBook( std::istream & fileStream, IStorage & storage,
	const std::string & fileName )
{
	static_assert( sizeof( double ) == 8,
		"Unsupported platform: double has to be 8 bytes." );

	try {
		CompoundFile::File file( fileStream, fileName );
		auto stream = file.stream( 
			file.hasDirectory( L"Workbook" ) ? file.directory( L"Workbook" ) 
			                                 : file.directory( L"Book") );

		std::vector< BoundSheet > boundSheets;

		loadGlobals( boundSheets, *stream, storage );

		loadWorkSheets( boundSheets, *stream, storage );
	}
	catch( const CompoundFile::Exception & x )
	{
		throw Exception( x.whatAsWString() );
	}
}